

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::Option<tcu::opt::LogImages>::Option<2ul>
          (Option<tcu::opt::LogImages> *this,char *shortName_,char *longName_,char *description_,
          NamedValue<bool> (*namedValues_) [2],char *defaultValue_)

{
  char *defaultValue__local;
  NamedValue<bool> (*namedValues__local) [2];
  char *description__local;
  char *longName__local;
  char *shortName__local;
  Option<tcu::opt::LogImages> *this_local;
  
  this->shortName = shortName_;
  this->longName = longName_;
  this->description = description_;
  this->defaultValue = defaultValue_;
  this->parse = (ParseFunc)0x0;
  this->namedValues = *namedValues_;
  this->namedValuesEnd = namedValues_[1];
  return;
}

Assistant:

Option (const char* shortName_, const char* longName_, const char* description_, const NamedValue<ValueType> (&namedValues_)[NumNamedValues], const char* defaultValue_ = DE_NULL)
		: shortName		(shortName_)
		, longName		(longName_)
		, description	(description_)
		, defaultValue	(defaultValue_)
		, parse			((ParseFunc)DE_NULL)
		, namedValues	(DE_ARRAY_BEGIN(namedValues_))
		, namedValuesEnd(DE_ARRAY_END(namedValues_))
	{
	}